

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_index_module.c
# Opt level: O1

ngx_int_t ngx_http_index_handler(ngx_http_request_t *r)

{
  long *plVar1;
  ngx_http_core_loc_conf_t *clcf;
  long lVar2;
  long lVar3;
  ngx_int_t nVar4;
  void *__dest;
  size_t reserved;
  ulong uVar5;
  char *fmt;
  ngx_err_t err;
  undefined8 uVar6;
  ngx_log_t *pnVar7;
  ngx_str_t *uri_00;
  u_char uVar8;
  size_t sVar9;
  u_char *puVar10;
  undefined1 auStack_1d8 [8];
  ngx_str_t uri;
  undefined1 auStack_168 [8];
  ngx_open_file_info_t of;
  long *plStack_f8;
  ngx_http_script_engine_t e;
  undefined1 local_88 [8];
  ngx_str_t dir;
  size_t root;
  u_char *local_50;
  undefined1 local_48 [8];
  ngx_str_t path;
  
  if (((r->uri).data[(r->uri).len - 1] == '/') && ((r->method & 0xe) != 0)) {
    plVar1 = (long *)r->loc_conf[ngx_http_index_module.ctx_index];
    clcf = (ngx_http_core_loc_conf_t *)r->loc_conf[ngx_http_core_module.ctx_index];
    dir.data = (u_char *)0x0;
    path.len = 0;
    if (((long *)*plVar1)[1] != 0) {
      lVar2 = *(long *)*plVar1;
      uVar6 = CONCAT71((int7)((ulong)plVar1 >> 8),1);
      local_50 = (u_char *)0x0;
      root = 0;
      uVar5 = 0;
      do {
        path.data._4_4_ = (uint)uVar6;
        uri_00 = (ngx_str_t *)(lVar2 + uVar5 * 0x20);
        if (*(long *)(lVar2 + 0x10 + uVar5 * 0x20) == 0) {
          if (*uri_00->data == '/') goto LAB_001666e4;
          reserved = plVar1[1];
          sVar9 = uri_00->len;
        }
        else {
          e._64_8_ = 0;
          e.line.len = 0;
          e.line.data = (u_char *)0x0;
          e.buf.len = 0;
          e.buf.data = (u_char *)0x0;
          e.pos = (u_char *)0x0;
          e.sp = (ngx_http_variable_value_t *)0x0;
          e.ip = (u_char *)0x0;
          plStack_f8 = *(long **)uri_00[1].len;
          e.args = &DAT_00000001;
          e.status = (ngx_int_t)r;
          if (*plStack_f8 == 0) {
            sVar9 = 1;
          }
          else {
            sVar9 = 1;
            do {
              lVar3 = (*(code *)*plStack_f8)(&plStack_f8);
              sVar9 = sVar9 + lVar3;
            } while (*plStack_f8 != 0);
          }
          reserved = sVar9 + 0x10;
        }
        if (root < reserved) {
          local_50 = ngx_http_map_uri_to_path(r,(ngx_str_t *)local_48,(size_t *)&dir.data,reserved);
          if (local_50 == (u_char *)0x0) {
            return -1;
          }
          root = (long)local_48 + (path.len - (long)local_50);
        }
        if (uri_00[1].data == (u_char *)0x0) {
          memcpy(local_50,uri_00->data,uri_00->len);
          local_48 = (undefined1  [8])(local_50 + ~path.len + uri_00->len);
        }
        else {
          plStack_f8 = *(long **)uri_00[1].data;
          lVar3 = *plStack_f8;
          e.ip = local_50;
          while (lVar3 != 0) {
            (*(code *)*plStack_f8)(&plStack_f8);
            lVar3 = *plStack_f8;
          }
          if (*local_50 == '/') {
            auStack_1d8 = (undefined1  [8])(sVar9 - 1);
            uri_00 = (ngx_str_t *)auStack_1d8;
            uri.len = (size_t)local_50;
            goto LAB_001666e4;
          }
          local_48 = (undefined1  [8])(e.ip + -path.len);
          *e.ip = '\0';
        }
        pnVar7 = r->connection->log;
        if ((pnVar7->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar7,0,"open index \"%V\"",(ngx_str_t *)local_48);
        }
        of.min_uses = 0;
        of.err = 0;
        of._60_4_ = 0;
        of.read_ahead = 0;
        of.size = 0;
        of.uniq = 0;
        of.mtime = 0;
        auStack_168 = (undefined1  [8])0x0;
        of.fd = 0;
        of._4_4_ = 0;
        of.directio = clcf->read_ahead;
        of.fs_size = clcf->directio;
        of.failed = (char *)clcf->open_file_cache_valid;
        of.valid = clcf->open_file_cache_min_uses;
        of.disable_symlinks_from =
             (size_t)(ushort)(((ushort)(int)clcf->open_file_cache_errors & 1) * 0x20 +
                              (short)(((uint)clcf->open_file_cache_events & 1) << 6) + 8);
        nVar4 = ngx_http_set_disable_symlinks
                          (r,clcf,(ngx_str_t *)local_48,(ngx_open_file_info_t *)auStack_168);
        if (nVar4 != 0) {
          return 500;
        }
        nVar4 = ngx_open_cached_file
                          (clcf->open_file_cache,(ngx_str_t *)local_48,
                           (ngx_open_file_info_t *)auStack_168,r->pool);
        if (nVar4 == 0) {
          auStack_1d8 = (undefined1  [8])((sVar9 + (r->uri).len) - 1);
          if (clcf->alias == 0) {
            uri.len = (size_t)(dir.data + path.len);
          }
          else {
            __dest = ngx_pnalloc(r->pool,(size_t)auStack_1d8);
            if (__dest == (void *)0x0) {
              return 500;
            }
            uri.len = (size_t)__dest;
            memcpy(__dest,(r->uri).data,(r->uri).len);
            memcpy((void *)((long)__dest + (r->uri).len),local_50,sVar9 - 1);
          }
          uri_00 = (ngx_str_t *)auStack_1d8;
LAB_001666e4:
          nVar4 = ngx_http_internal_redirect(r,uri_00,&r->args);
          return nVar4;
        }
        if ((int)of.read_ahead == 0) {
          return 500;
        }
        pnVar7 = r->connection->log;
        if ((pnVar7->log_level & 0x100) != 0) {
          ngx_log_error_core(8,pnVar7,(int)of.read_ahead,"%s \"%s\" failed",of._56_8_,path.len);
        }
        if ((of.read_ahead & 0xffffffff) < 0x29) {
          nVar4 = 0x193;
          if ((0x1000102000U >> (of.read_ahead & 0x3f) & 1) != 0) {
            if ((int)of.read_ahead == 0xd) {
              pnVar7 = r->connection->log;
              if (pnVar7->log_level < 4) {
                return 0x193;
              }
              fmt = "\"%s\" is forbidden";
              err = 0xd;
            }
            else {
              nVar4 = 0x194;
              if (clcf->log_not_found == 0) {
                return 0x194;
              }
              pnVar7 = r->connection->log;
              if (pnVar7->log_level < 4) {
                return 0x194;
              }
              fmt = "\"%s\" is not found";
              err = (int)of.read_ahead;
            }
            ngx_log_error_core(4,pnVar7,err,fmt,path.len);
            return nVar4;
          }
          if ((0x10080000000U >> (of.read_ahead & 0x3f) & 1) != 0) {
            return 0x193;
          }
        }
        if ((path.data._4_4_ & 1) != 0) {
          uVar8 = local_50[-1];
          puVar10 = local_50 + -1;
          if ((u_char *)path.len == local_50 + -1 || uVar8 != '/') {
            uVar8 = *local_50;
            puVar10 = local_50;
          }
          path.data._4_1_ = uVar8;
          *puVar10 = '\0';
          local_88 = (undefined1  [8])((long)puVar10 - path.len);
          dir.len = path.len;
          pnVar7 = r->connection->log;
          if ((pnVar7->log_level & 0x100) != 0) {
            ngx_log_error_core(8,pnVar7,0,"http index check dir: \"%V\"");
          }
          uri.data = (u_char *)0x0;
          auStack_1d8 = (undefined1  [8])0x0;
          uri.len = 0;
          nVar4 = ngx_http_set_disable_symlinks
                            (r,clcf,(ngx_str_t *)local_88,(ngx_open_file_info_t *)auStack_1d8);
          if (nVar4 != 0) {
            return 500;
          }
          nVar4 = ngx_open_cached_file
                            (clcf->open_file_cache,(ngx_str_t *)local_88,
                             (ngx_open_file_info_t *)auStack_1d8,r->pool);
          if (nVar4 != 0) {
            return 500;
          }
          *puVar10 = path.data._4_1_;
          pnVar7 = r->connection->log;
          if (1 < pnVar7->log_level) {
            ngx_log_error_core(2,pnVar7,0,"\"%s\" is not a directory",dir.len);
            return 500;
          }
          return 500;
        }
        if ((int)of.read_ahead != 2) {
          pnVar7 = r->connection->log;
          if (pnVar7->log_level < 3) {
            return 500;
          }
          ngx_log_error_core(3,pnVar7,(int)of.read_ahead,"%s \"%s\" failed",of._56_8_,path.len);
          return 500;
        }
        uVar5 = uVar5 + 1;
        uVar6 = 0;
      } while (uVar5 < *(ulong *)(*plVar1 + 8));
    }
  }
  return -5;
}

Assistant:

static ngx_int_t
ngx_http_index_handler(ngx_http_request_t *r)
{
    u_char                       *p, *name;
    size_t                        len, root, reserve, allocated;
    ngx_int_t                     rc;
    ngx_str_t                     path, uri;
    ngx_uint_t                    i, dir_tested;
    ngx_http_index_t             *index;
    ngx_open_file_info_t          of;
    ngx_http_script_code_pt       code;
    ngx_http_script_engine_t      e;
    ngx_http_core_loc_conf_t     *clcf;
    ngx_http_index_loc_conf_t    *ilcf;
    ngx_http_script_len_code_pt   lcode;

    if (r->uri.data[r->uri.len - 1] != '/') {
        return NGX_DECLINED;
    }

    if (!(r->method & (NGX_HTTP_GET|NGX_HTTP_HEAD|NGX_HTTP_POST))) {
        return NGX_DECLINED;
    }

    ilcf = ngx_http_get_module_loc_conf(r, ngx_http_index_module);
    clcf = ngx_http_get_module_loc_conf(r, ngx_http_core_module);

    allocated = 0;
    root = 0;
    dir_tested = 0;
    name = NULL;
    /* suppress MSVC warning */
    path.data = NULL;

    index = ilcf->indices->elts;
    for (i = 0; i < ilcf->indices->nelts; i++) {

        if (index[i].lengths == NULL) {

            if (index[i].name.data[0] == '/') {
                return ngx_http_internal_redirect(r, &index[i].name, &r->args);
            }

            reserve = ilcf->max_index_len;
            len = index[i].name.len;

        } else {
            ngx_memzero(&e, sizeof(ngx_http_script_engine_t));

            e.ip = index[i].lengths->elts;
            e.request = r;
            e.flushed = 1;

            /* 1 is for terminating '\0' as in static names */
            len = 1;

            while (*(uintptr_t *) e.ip) {
                lcode = *(ngx_http_script_len_code_pt *) e.ip;
                len += lcode(&e);
            }

            /* 16 bytes are preallocation */

            reserve = len + 16;
        }

        if (reserve > allocated) {

            name = ngx_http_map_uri_to_path(r, &path, &root, reserve);
            if (name == NULL) {
                return NGX_ERROR;
            }

            allocated = path.data + path.len - name;
        }

        if (index[i].values == NULL) {

            /* index[i].name.len includes the terminating '\0' */

            ngx_memcpy(name, index[i].name.data, index[i].name.len);

            path.len = (name + index[i].name.len - 1) - path.data;

        } else {
            e.ip = index[i].values->elts;
            e.pos = name;

            while (*(uintptr_t *) e.ip) {
                code = *(ngx_http_script_code_pt *) e.ip;
                code((ngx_http_script_engine_t *) &e);
            }

            if (*name == '/') {
                uri.len = len - 1;
                uri.data = name;
                return ngx_http_internal_redirect(r, &uri, &r->args);
            }

            path.len = e.pos - path.data;

            *e.pos = '\0';
        }

        ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                       "open index \"%V\"", &path);

        ngx_memzero(&of, sizeof(ngx_open_file_info_t));

        of.read_ahead = clcf->read_ahead;
        of.directio = clcf->directio;
        of.valid = clcf->open_file_cache_valid;
        of.min_uses = clcf->open_file_cache_min_uses;
        of.test_only = 1;
        of.errors = clcf->open_file_cache_errors;
        of.events = clcf->open_file_cache_events;

        if (ngx_http_set_disable_symlinks(r, clcf, &path, &of) != NGX_OK) {
            return NGX_HTTP_INTERNAL_SERVER_ERROR;
        }

        if (ngx_open_cached_file(clcf->open_file_cache, &path, &of, r->pool)
            != NGX_OK)
        {
            if (of.err == 0) {
                return NGX_HTTP_INTERNAL_SERVER_ERROR;
            }

            ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, of.err,
                           "%s \"%s\" failed", of.failed, path.data);

#if (NGX_HAVE_OPENAT)
            if (of.err == NGX_EMLINK
                || of.err == NGX_ELOOP)
            {
                return NGX_HTTP_FORBIDDEN;
            }
#endif

            if (of.err == NGX_ENOTDIR
                || of.err == NGX_ENAMETOOLONG
                || of.err == NGX_EACCES)
            {
                return ngx_http_index_error(r, clcf, path.data, of.err);
            }

            if (!dir_tested) {
                rc = ngx_http_index_test_dir(r, clcf, path.data, name - 1);

                if (rc != NGX_OK) {
                    return rc;
                }

                dir_tested = 1;
            }

            if (of.err == NGX_ENOENT) {
                continue;
            }

            ngx_log_error(NGX_LOG_CRIT, r->connection->log, of.err,
                          "%s \"%s\" failed", of.failed, path.data);

            return NGX_HTTP_INTERNAL_SERVER_ERROR;
        }

        uri.len = r->uri.len + len - 1;

        if (!clcf->alias) {
            uri.data = path.data + root;

        } else {
            uri.data = ngx_pnalloc(r->pool, uri.len);
            if (uri.data == NULL) {
                return NGX_HTTP_INTERNAL_SERVER_ERROR;
            }

            p = ngx_copy(uri.data, r->uri.data, r->uri.len);
            ngx_memcpy(p, name, len - 1);
        }

        return ngx_http_internal_redirect(r, &uri, &r->args);
    }

    return NGX_DECLINED;
}